

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cc
# Opt level: O1

bool kratos::fs::exists(string *filename)

{
  int iVar1;
  long local_220;
  ifstream in;
  int aiStack_200 [122];
  
  std::ifstream::ifstream(&local_220,(string *)filename,_S_in);
  iVar1 = *(int *)((long)aiStack_200 + *(long *)(local_220 + -0x18));
  std::ifstream::~ifstream(&local_220);
  return iVar1 == 0;
}

Assistant:

bool exists(const std::string &filename) {
#if defined(INCLUDE_FILESYSTEM)
    namespace fs = std::filesystem;
    return fs::exists(filename);
#else
    std::ifstream in(filename);
    return in.good();
#endif
}